

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O2

void __thiscall
QTlsPrivate::TlsKeyOpenSSL::decodePem
          (TlsKeyOpenSSL *this,KeyType type,KeyAlgorithm algorithm,QByteArray *pem,
          QByteArray *passPhrase,bool deepClear)

{
  BIO *a;
  RSA *pRVar1;
  EVP_PKEY *a_00;
  DH *pDVar2;
  char *pcVar3;
  
  if ((pem->d).size == 0) {
    return;
  }
  (this->super_TlsKeyBase).keyType = type;
  (this->super_TlsKeyBase).keyAlgorithm = algorithm;
  clear(this,deepClear);
  pcVar3 = (pem->d).ptr;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)&QByteArray::_empty;
  }
  a = q_BIO_new_mem_buf(pcVar3,(int)(pem->d).size);
  if (a == (BIO *)0x0) {
    return;
  }
  pcVar3 = (passPhrase->d).ptr;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)&QByteArray::_empty;
  }
  switch(algorithm) {
  case Rsa:
    if (type == PublicKey) {
      pRVar1 = q_PEM_read_bio_RSA_PUBKEY(a,&(this->field_0).rsa,(pem_password_cb *)0x0,pcVar3);
    }
    else {
      pRVar1 = q_PEM_read_bio_RSAPrivateKey(a,&(this->field_0).rsa,(pem_password_cb *)0x0,pcVar3);
    }
    break;
  case Dsa:
    if (type == PublicKey) {
      pRVar1 = (RSA *)q_PEM_read_bio_DSA_PUBKEY
                                (a,&(this->field_0).dsa,(pem_password_cb *)0x0,pcVar3);
    }
    else {
      pRVar1 = (RSA *)q_PEM_read_bio_DSAPrivateKey
                                (a,&(this->field_0).dsa,(pem_password_cb *)0x0,pcVar3);
    }
    break;
  case Ec:
    if (type == PublicKey) {
      pRVar1 = (RSA *)q_PEM_read_bio_EC_PUBKEY(a,&(this->field_0).ec,(pem_password_cb *)0x0,pcVar3);
    }
    else {
      pRVar1 = (RSA *)q_PEM_read_bio_ECPrivateKey
                                (a,&(this->field_0).ec,(pem_password_cb *)0x0,pcVar3);
    }
    break;
  case Dh:
    if (type == PublicKey) {
      a_00 = q_PEM_read_bio_PUBKEY(a,(EVP_PKEY **)0x0,(pem_password_cb *)0x0,pcVar3);
    }
    else {
      a_00 = q_PEM_read_bio_PrivateKey(a,(EVP_PKEY **)0x0,(pem_password_cb *)0x0,pcVar3);
    }
    if (a_00 == (EVP_PKEY *)0x0) {
      pDVar2 = (DH *)(this->field_0).opaque;
    }
    else {
      pDVar2 = q_EVP_PKEY_get1_DH(a_00);
      (this->field_0).dh = pDVar2;
    }
    if (pDVar2 != (DH *)0x0) {
      (this->super_TlsKeyBase).keyIsNull = false;
    }
    q_EVP_PKEY_free(a_00);
  default:
    goto switchD_00121e0d_default;
  }
  if (((RSA *)(this->field_0).opaque != (RSA *)0x0) && ((RSA *)(this->field_0).opaque == pRVar1)) {
    (this->super_TlsKeyBase).keyIsNull = false;
  }
switchD_00121e0d_default:
  q_BIO_free(a);
  return;
}

Assistant:

constexpr bool isEmpty() const noexcept { return size() == 0; }